

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O3

void __thiscall
spirv_cross::CompilerMSL::extract_global_variables_from_function
          (CompilerMSL *this,uint32_t func_id,
          set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *added_arg_ids,
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          *global_var_ids,
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          *processed_func_ids)

{
  _Rb_tree_const_iterator<unsigned_int> __last;
  StorageClass SVar1;
  size_t sVar2;
  Parameter *pPVar3;
  Decoration *pDVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  uint32_t uVar12;
  uint32_t uVar13;
  uint32_t uVar14;
  uint32_t uVar15;
  uint32_t uVar16;
  uint32_t uVar17;
  uint32_t uVar18;
  BuiltIn BVar19;
  uint32_t uVar20;
  uint32_t uVar21;
  uint32_t uVar22;
  TypeID TVar23;
  SPIRFunction *pSVar24;
  bool bVar25;
  uint32_t uVar26;
  ExecutionModel EVar27;
  ID IVar28;
  iterator iVar29;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  *p_Var30;
  SPIRBlock *pSVar31;
  uint32_t *puVar32;
  const_iterator cVar33;
  _Node_iterator_base<unsigned_int,_false> _Var34;
  SPIRType *pSVar35;
  mapped_type *pmVar36;
  mapped_type *pmVar37;
  uint7 uVar39;
  SPIRVariable *pSVar38;
  TypedID<(spirv_cross::Types)6> *pTVar40;
  char *pcVar41;
  long lVar42;
  Instruction *instr;
  ulong uVar43;
  _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *p_Var44;
  CompilerMSL *pCVar45;
  _Base_ptr p_Var46;
  _Base_ptr p_Var47;
  uint32_t rvalue_id;
  uint32_t type_id;
  uint32_t ptr_type_id;
  __node_gen_type __node_gen;
  ID local_12c;
  TypeID local_128;
  key_type local_124;
  SPIRVariable *local_120;
  CompilerMSL *local_118;
  key_type local_10c;
  _Base_ptr local_108;
  uint32_t local_fc;
  SmallVector<spirv_cross::SPIRFunction::Parameter,_8UL> *local_f8;
  SPIRFunction *local_f0;
  ParsedIR *local_e8;
  undefined1 local_e0 [32];
  _Base_ptr local_c0;
  undefined8 local_b8;
  _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *local_b0;
  uint32_t *local_a8;
  ulong local_a0;
  ulong local_98;
  TypedID<(spirv_cross::Types)6> *local_90;
  SPIRType *local_88;
  key_type local_7c;
  _Base_ptr local_78;
  string local_70;
  string local_50;
  
  local_fc = func_id;
  iVar29 = ::std::
           _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
           ::find(&processed_func_ids->_M_h,&local_fc);
  if (iVar29.super__Node_iterator_base<unsigned_int,_false>._M_cur == (__node_type *)0x0) {
    local_108 = (_Base_ptr)processed_func_ids;
    local_e0._0_8_ = processed_func_ids;
    ::std::
    _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::
    _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
              ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)processed_func_ids,&local_fc);
    local_f0 = Variant::get<spirv_cross::SPIRFunction>
                         ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                          super_VectorView<spirv_cross::Variant>.ptr + local_fc);
    sVar2 = (local_f0->blocks).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)6>_>.
            buffer_size;
    local_118 = this;
    if (sVar2 != 0) {
      pTVar40 = (local_f0->blocks).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)6>_>.
                ptr;
      local_90 = pTVar40 + sVar2;
      local_f8 = (SmallVector<spirv_cross::SPIRFunction::Parameter,_8UL> *)&this->atomic_image_vars;
      local_88 = (SPIRType *)&this->builtin_frag_coord_id;
      local_b0 = (_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  *)&this->builtin_layer_id;
      local_a8 = &this->builtin_view_idx_id;
      do {
        local_e8 = (ParsedIR *)pTVar40;
        pSVar31 = Variant::get<spirv_cross::SPIRBlock>
                            ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                             super_VectorView<spirv_cross::Variant>.ptr + pTVar40->id);
        sVar2 = (pSVar31->ops).super_VectorView<spirv_cross::Instruction>.buffer_size;
        if (sVar2 != 0) {
          instr = (pSVar31->ops).super_VectorView<spirv_cross::Instruction>.ptr;
          local_120 = (SPIRVariable *)(instr + sVar2);
          do {
            puVar32 = Compiler::stream((Compiler *)this,instr);
            switch(instr->op) {
            case 0x39:
              if (3 < instr->length) {
                uVar43 = 3;
                do {
                  local_e0._0_4_ = puVar32[uVar43];
                  iVar29 = ::std::
                           _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                           ::find(&global_var_ids->_M_h,(key_type *)local_e0);
                  if (iVar29.super__Node_iterator_base<unsigned_int,_false>._M_cur !=
                      (__node_type *)0x0) {
                    ::std::
                    _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                    ::_M_insert_unique<unsigned_int_const&>
                              ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                                *)added_arg_ids,(uint *)local_e0);
                  }
                  uVar43 = uVar43 + 1;
                } while (uVar43 < instr->length);
              }
              local_e0._8_8_ = local_e0._8_8_ & 0xffffffff00000000;
              local_e0._16_8_ = 0;
              __last._M_node = (_Base_ptr)(local_e0 + 8);
              local_b8 = 0;
              local_e0._24_8_ = __last._M_node;
              local_c0 = __last._M_node;
              extract_global_variables_from_function
                        (local_118,puVar32[2],
                         (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                          *)local_e0,global_var_ids,
                         (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                          *)local_108);
              ::std::
              _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
              ::_M_insert_range_unique<std::_Rb_tree_const_iterator<unsigned_int>>
                        ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                          *)added_arg_ids,(_Rb_tree_const_iterator<unsigned_int>)local_e0._24_8_,
                         __last);
              ::std::
              _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
              ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                           *)local_e0);
              this = local_118;
              break;
            case 0x3a:
            case 0x3b:
            case 0x3f:
            case 0x40:
              break;
            case 0x3c:
              local_e0._0_4_ = puVar32[2];
              pSVar38 = Compiler::maybe_get_backing_variable((Compiler *)this,puVar32[2]);
              if (pSVar38 != (SPIRVariable *)0x0) {
                local_12c.id = (pSVar38->super_IVariant).self.id;
                cVar33 = ::std::
                         _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                         ::find((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                                 *)local_f8,&local_12c.id);
                if (cVar33.super__Node_iterator_base<unsigned_int,_false>._M_cur !=
                    (__node_type *)0x0) goto LAB_002559c6;
              }
              break;
            case 0x3d:
            case 0x41:
            case 0x42:
            case 0x43:
            case 0x44:
              local_e0._0_4_ = puVar32[2];
              iVar29 = ::std::
                       _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                       ::find(&global_var_ids->_M_h,(key_type *)local_e0);
              if (iVar29.super__Node_iterator_base<unsigned_int,_false>._M_cur != (__node_type *)0x0
                 ) {
                ::std::
                _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                ::_M_insert_unique<unsigned_int_const&>
                          ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                            *)added_arg_ids,(uint *)local_e0);
              }
              pSVar35 = Variant::get<spirv_cross::SPIRType>
                                  ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                                   super_VectorView<spirv_cross::Variant>.ptr + *puVar32);
              if (((*(int *)&(pSVar35->super_IVariant).field_0xc == 0x10) &&
                  ((pSVar35->image).dim == DimSubpassData)) &&
                 (((this->msl_options).platform != iOS ||
                  ((this->msl_options).ios_use_framebuffer_fetch_subpasses == false)))) {
                if (*(uint32_t *)&(local_88->super_IVariant)._vptr_IVariant == 0) {
                  __assert_fail("builtin_frag_coord_id != 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/spirv_msl.cpp"
                                ,0x562,
                                "void spirv_cross::CompilerMSL::extract_global_variables_from_function(uint32_t, std::set<uint32_t> &, unordered_set<uint32_t> &, unordered_set<uint32_t> &)"
                               );
                }
                ::std::
                _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                ::_M_insert_unique<unsigned_int_const&>
                          ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                            *)added_arg_ids,(uint *)local_88);
                if ((this->msl_options).multiview == true) {
                  p_Var44 = (_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)local_a8;
                  if (*local_a8 == 0) {
                    __assert_fail("builtin_view_idx_id != 0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/spirv_msl.cpp"
                                  ,0x567,
                                  "void spirv_cross::CompilerMSL::extract_global_variables_from_function(uint32_t, std::set<uint32_t> &, unordered_set<uint32_t> &, unordered_set<uint32_t> &)"
                                 );
                  }
                }
                else {
                  if ((this->msl_options).arrayed_subpass_input != true) break;
                  p_Var44 = local_b0;
                  if (*(uint32_t *)local_b0 == 0) {
                    __assert_fail("builtin_layer_id != 0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/spirv_msl.cpp"
                                  ,0x56d,
                                  "void spirv_cross::CompilerMSL::extract_global_variables_from_function(uint32_t, std::set<uint32_t> &, unordered_set<uint32_t> &, unordered_set<uint32_t> &)"
                                 );
                  }
                }
                goto LAB_00255a2b;
              }
              break;
            case 0x3e:
              local_e0._0_4_ = *puVar32;
              iVar29 = ::std::
                       _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                       ::find(&global_var_ids->_M_h,(key_type *)local_e0);
              if (iVar29.super__Node_iterator_base<unsigned_int,_false>._M_cur != (__node_type *)0x0
                 ) {
                ::std::
                _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                ::_M_insert_unique<unsigned_int_const&>
                          ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                            *)added_arg_ids,(uint *)local_e0);
              }
              local_12c.id = puVar32[1];
              _Var34._M_cur =
                   (__node_type *)
                   ::std::
                   _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   ::find(&global_var_ids->_M_h,&local_12c.id);
              p_Var44 = (_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&local_12c;
joined_r0x00255a1f:
              if (_Var34._M_cur != (__node_type *)0x0) {
LAB_00255a2b:
                ::std::
                _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                ::_M_insert_unique<unsigned_int_const&>
                          ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                            *)added_arg_ids,(uint *)p_Var44);
              }
              break;
            default:
              if (instr->op == 0xa9) {
                local_e0._0_4_ = puVar32[3];
                iVar29 = ::std::
                         _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                         ::find(&global_var_ids->_M_h,(key_type *)local_e0);
                if (iVar29.super__Node_iterator_base<unsigned_int,_false>._M_cur !=
                    (__node_type *)0x0) {
                  ::std::
                  _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                  ::_M_insert_unique<unsigned_int_const&>
                            ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                              *)added_arg_ids,(uint *)local_e0);
                }
                local_e0._0_4_ = puVar32[4];
LAB_002559c6:
                _Var34._M_cur =
                     (__node_type *)
                     ::std::
                     _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     ::find(&global_var_ids->_M_h,(key_type *)local_e0);
                p_Var44 = (_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)local_e0;
                goto joined_r0x00255a1f;
              }
            }
            instr = instr + 1;
          } while ((SPIRVariable *)instr != local_120);
        }
        pTVar40 = (TypedID<(spirv_cross::Types)6> *)((long)local_e8 + 4);
      } while (pTVar40 != local_90);
    }
    p_Var30 = &::std::__detail::
               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&this->function_global_vars,&local_fc)->_M_t;
    ::std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::operator=(p_Var30,&added_arg_ids->_M_t);
    if (local_fc != (this->super_CompilerGLSL).super_Compiler.ir.default_entry_point.id) {
      local_108 = (added_arg_ids->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var47 = &(added_arg_ids->_M_t)._M_impl.super__Rb_tree_header._M_header;
      if (local_108 != p_Var47) {
        local_e8 = &(this->super_CompilerGLSL).super_Compiler.ir;
        local_f8 = &local_f0->arguments;
        local_b0 = (_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    *)&(this->super_CompilerGLSL).super_Compiler.ir.meta;
        local_98 = 0;
        local_a0 = 0;
        local_78 = p_Var47;
        do {
          local_12c.id = local_108[1]._M_color;
          local_120 = Variant::get<spirv_cross::SPIRVariable>
                                ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                                 super_VectorView<spirv_cross::Variant>.ptr + local_12c.id);
          local_128.id = *(uint32_t *)&(local_120->super_IVariant).field_0xc;
          pSVar35 = Variant::get<spirv_cross::SPIRType>
                              ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                               super_VectorView<spirv_cross::Variant>.ptr + local_128.id);
          uVar26 = Compiler::get_decoration((Compiler *)this,local_12c,DecorationBuiltIn);
          bVar25 = Compiler::is_tessellation_shader((Compiler *)this);
          if (((((!bVar25) || (local_120->storage != StorageClassInput)) &&
               ((EVar27 = Compiler::get_execution_model((Compiler *)this),
                EVar27 != ExecutionModelTessellationControl ||
                (local_120->storage != StorageClassOutput)))) ||
              ((bVar25 = Compiler::has_decoration((Compiler *)this,local_12c,DecorationPatch),
               bVar25 || (bVar25 = is_patch_block(this,pSVar35), bVar25)))) ||
             ((bVar25 = Compiler::is_builtin_variable((Compiler *)this,local_120),
              p_Var46 = local_108, bVar25 &&
              (((4 < uVar26 || (uVar26 == 2)) &&
               (*(int *)&(pSVar35->super_IVariant).field_0xc != 0xf)))))) {
            bVar25 = Compiler::is_builtin_variable((Compiler *)this,local_120);
            if ((bVar25) && (*(int *)&(pSVar35->super_IVariant).field_0xc == 0xf)) {
              local_128.id = Compiler::get_pointee_type_id((Compiler *)this,local_128.id);
              pSVar35 = Variant::get<spirv_cross::SPIRType>
                                  ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                                   super_VectorView<spirv_cross::Variant>.ptr + local_128.id);
              sVar2 = (pSVar35->member_types).
                      super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size;
              this = local_118;
              p_Var46 = local_108;
              if (sVar2 != 0) {
                local_90 = (TypedID<(spirv_cross::Types)6> *)
                           (pSVar35->member_types).
                           super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr;
                lVar42 = sVar2 << 2;
                uVar43 = 0;
                local_88 = pSVar35;
                do {
                  local_e0._0_4_ = 0x7fffffff;
                  bVar25 = Compiler::is_member_builtin
                                     ((Compiler *)local_118,local_88,(uint32_t)uVar43,
                                      (BuiltIn *)local_e0);
                  if (bVar25) {
                    bVar25 = Compiler::has_active_builtin
                                       ((Compiler *)local_118,local_e0._0_4_,local_120->storage);
                    if (bVar25) {
                      uVar26 = ParsedIR::increase_bound_by(local_e8,2);
                      pTVar40 = local_90;
                      pCVar45 = local_118;
                      local_a8 = (uint32_t *)CONCAT44(local_a8._4_4_,uVar26 + 1);
                      local_124.id = uVar26;
                      pSVar35 = Variant::get<spirv_cross::SPIRType>
                                          ((local_118->super_CompilerGLSL).super_Compiler.ir.ids.
                                           super_VectorView<spirv_cross::Variant>.ptr +
                                           local_90[uVar43].id);
                      pSVar35 = Compiler::set<spirv_cross::SPIRType,spirv_cross::SPIRType&>
                                          ((Compiler *)pCVar45,uVar26,pSVar35);
                      pSVar24 = local_f0;
                      uVar26 = pTVar40[uVar43].id;
                      (pSVar35->super_IVariant).self.id = uVar26;
                      pSVar35->storage = local_120->storage;
                      pSVar35->pointer = true;
                      (pSVar35->parent_type).id = uVar26;
                      uVar26 = pTVar40[uVar43].id;
                      SmallVector<spirv_cross::SPIRFunction::Parameter,_8UL>::reserve
                                (local_f8,(local_f0->arguments).
                                          super_VectorView<spirv_cross::SPIRFunction::Parameter>.
                                          buffer_size + 1);
                      pPVar3 = (pSVar24->arguments).
                               super_VectorView<spirv_cross::SPIRFunction::Parameter>.ptr;
                      sVar2 = (pSVar24->arguments).
                              super_VectorView<spirv_cross::SPIRFunction::Parameter>.buffer_size;
                      pPVar3[sVar2].type.id = uVar26;
                      pPVar3[sVar2].id.id = (uint32_t)local_a8;
                      pPVar3[sVar2].read_count = 0;
                      pPVar3[sVar2].write_count = 0;
                      pPVar3[sVar2].alias_global_variable = true;
                      (pSVar24->arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.
                      buffer_size = sVar2 + 1;
                      local_10c.id = 7;
                      Compiler::set<spirv_cross::SPIRVariable,unsigned_int&,spv::StorageClass>
                                ((Compiler *)pCVar45,(uint32_t)local_a8,&local_124.id,&local_10c.id)
                      ;
                      p_Var44 = local_b0;
                      local_10c.id = local_128.id;
                      pmVar36 = ::std::__detail::
                                _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                ::operator[](local_b0,&local_10c);
                      pDVar4 = (pmVar36->members).super_VectorView<spirv_cross::Meta::Decoration>.
                               ptr;
                      pmVar36 = (mapped_type *)(pDVar4 + (uVar43 & 0xffffffff));
                      local_7c.id = (uint32_t)local_a8;
                      pmVar37 = ::std::__detail::
                                _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                ::operator[](p_Var44,&local_7c);
                      ::std::__cxx11::string::_M_assign((string *)pmVar37);
                      ::std::__cxx11::string::_M_assign
                                ((string *)&(pmVar37->decoration).qualified_alias);
                      ::std::__cxx11::string::_M_assign
                                ((string *)&(pmVar37->decoration).hlsl_semantic);
                      (pmVar37->decoration).decoration_flags.lower =
                           pDVar4[uVar43 & 0xffffffff].decoration_flags.lower;
                      if (pmVar36 == pmVar37) {
                        BVar19 = (pmVar36->decoration).builtin_type;
                        uVar20 = (pmVar36->decoration).location;
                        uVar21 = (pmVar36->decoration).component;
                        uVar22 = (pmVar36->decoration).set;
                        uVar15 = (pmVar36->decoration).binding;
                        uVar16 = (pmVar36->decoration).offset;
                        uVar17 = (pmVar36->decoration).xfb_buffer;
                        uVar18 = (pmVar36->decoration).xfb_stride;
                        uVar26 = (pmVar36->decoration).stream;
                        uVar12 = (pmVar36->decoration).array_stride;
                        uVar13 = (pmVar36->decoration).matrix_stride;
                        uVar14 = (pmVar36->decoration).input_attachment;
                        uVar5 = *(undefined8 *)((long)&(pmVar36->decoration).index + 1);
                        *(undefined8 *)((long)&(pmVar37->decoration).input_attachment + 1) =
                             *(undefined8 *)((long)&(pmVar36->decoration).input_attachment + 1);
                        *(undefined8 *)((long)&(pmVar37->decoration).index + 1) = uVar5;
                        (pmVar37->decoration).stream = uVar26;
                        (pmVar37->decoration).array_stride = uVar12;
                        (pmVar37->decoration).matrix_stride = uVar13;
                        (pmVar37->decoration).input_attachment = uVar14;
                        (pmVar37->decoration).binding = uVar15;
                        (pmVar37->decoration).offset = uVar16;
                        (pmVar37->decoration).xfb_buffer = uVar17;
                        (pmVar37->decoration).xfb_stride = uVar18;
                        (pmVar37->decoration).builtin_type = BVar19;
                        (pmVar37->decoration).location = uVar20;
                        (pmVar37->decoration).component = uVar21;
                        (pmVar37->decoration).set = uVar22;
                        (pmVar37->decoration).extended.flags.lower =
                             (pmVar36->decoration).extended.flags.lower;
                      }
                      else {
                        ::std::
                        _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                        ::
                        _M_assign_elements<std::_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>const&>
                                  ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                                    *)&(pmVar37->decoration).decoration_flags.higher,
                                   &(pmVar36->decoration).decoration_flags.higher._M_h);
                        BVar19 = (pmVar36->decoration).builtin_type;
                        uVar20 = (pmVar36->decoration).location;
                        uVar21 = (pmVar36->decoration).component;
                        uVar22 = (pmVar36->decoration).set;
                        uVar15 = (pmVar36->decoration).binding;
                        uVar16 = (pmVar36->decoration).offset;
                        uVar17 = (pmVar36->decoration).xfb_buffer;
                        uVar18 = (pmVar36->decoration).xfb_stride;
                        uVar26 = (pmVar36->decoration).stream;
                        uVar12 = (pmVar36->decoration).array_stride;
                        uVar13 = (pmVar36->decoration).matrix_stride;
                        uVar14 = (pmVar36->decoration).input_attachment;
                        uVar5 = *(undefined8 *)((long)&(pmVar36->decoration).index + 1);
                        *(undefined8 *)((long)&(pmVar37->decoration).input_attachment + 1) =
                             *(undefined8 *)((long)&(pmVar36->decoration).input_attachment + 1);
                        *(undefined8 *)((long)&(pmVar37->decoration).index + 1) = uVar5;
                        (pmVar37->decoration).stream = uVar26;
                        (pmVar37->decoration).array_stride = uVar12;
                        (pmVar37->decoration).matrix_stride = uVar13;
                        (pmVar37->decoration).input_attachment = uVar14;
                        (pmVar37->decoration).binding = uVar15;
                        (pmVar37->decoration).offset = uVar16;
                        (pmVar37->decoration).xfb_buffer = uVar17;
                        (pmVar37->decoration).xfb_stride = uVar18;
                        (pmVar37->decoration).builtin_type = BVar19;
                        (pmVar37->decoration).location = uVar20;
                        (pmVar37->decoration).component = uVar21;
                        (pmVar37->decoration).set = uVar22;
                        (pmVar37->decoration).extended.flags.lower =
                             (pmVar36->decoration).extended.flags.lower;
                        ::std::
                        _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                        ::
                        _M_assign_elements<std::_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>const&>
                                  ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                                    *)&(pmVar37->decoration).extended.flags.higher,
                                   &(pmVar36->decoration).extended.flags.higher._M_h);
                      }
                      uVar5 = *(undefined8 *)(pmVar36->decoration).extended.values;
                      uVar6 = *(undefined8 *)((pmVar36->decoration).extended.values + 2);
                      uVar7 = *(undefined8 *)((pmVar36->decoration).extended.values + 4);
                      uVar8 = *(undefined8 *)((pmVar36->decoration).extended.values + 6);
                      uVar9 = *(undefined8 *)((pmVar36->decoration).extended.values + 8);
                      uVar10 = *(undefined8 *)((pmVar36->decoration).extended.values + 10);
                      uVar11 = *(undefined8 *)((pmVar36->decoration).extended.values + 0xd);
                      *(undefined8 *)((pmVar37->decoration).extended.values + 0xb) =
                           *(undefined8 *)((pmVar36->decoration).extended.values + 0xb);
                      *(undefined8 *)((pmVar37->decoration).extended.values + 0xd) = uVar11;
                      *(undefined8 *)((pmVar37->decoration).extended.values + 8) = uVar9;
                      *(undefined8 *)((pmVar37->decoration).extended.values + 10) = uVar10;
                      *(undefined8 *)((pmVar37->decoration).extended.values + 4) = uVar7;
                      *(undefined8 *)((pmVar37->decoration).extended.values + 6) = uVar8;
                      *(undefined8 *)(pmVar37->decoration).extended.values = uVar5;
                      *(undefined8 *)((pmVar37->decoration).extended.values + 2) = uVar6;
                      p_Var46 = local_108;
                      p_Var47 = local_78;
                    }
                  }
                  uVar43 = uVar43 + 1;
                  lVar42 = lVar42 + -4;
                  this = local_118;
                } while (lVar42 != 0);
              }
            }
            else {
              uVar26 = ParsedIR::increase_bound_by(local_e8,1);
              pSVar24 = local_f0;
              TVar23.id = local_128.id;
              SmallVector<spirv_cross::SPIRFunction::Parameter,_8UL>::reserve
                        (local_f8,(local_f0->arguments).
                                  super_VectorView<spirv_cross::SPIRFunction::Parameter>.buffer_size
                                  + 1);
              this = local_118;
              pPVar3 = (pSVar24->arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.
                       ptr;
              sVar2 = (pSVar24->arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.
                      buffer_size;
              pPVar3[sVar2].type.id = TVar23.id;
              pPVar3[sVar2].id.id = uVar26;
              pPVar3[sVar2].read_count = 0;
              pPVar3[sVar2].write_count = 0;
              pPVar3[sVar2].alias_global_variable = true;
              (pSVar24->arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.
              buffer_size = sVar2 + 1;
              local_e0._0_4_ = 7;
              local_124.id = 0;
              local_120 = (SPIRVariable *)CONCAT44(local_120._4_4_,uVar26);
              Compiler::
              set<spirv_cross::SPIRVariable,unsigned_int&,spv::StorageClass,int,unsigned_int&>
                        ((Compiler *)local_118,uVar26,&local_128.id,(StorageClass *)local_e0,
                         (int *)&local_124,&local_12c.id);
              IVar28.id = local_12c.id;
              (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                        (&local_50,this,(ulong)local_12c.id,1);
              local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
              pCVar45 = (CompilerMSL *)0x2d3bb3;
              ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"v","");
              ensure_valid_name((string *)local_e0,pCVar45,&local_50,&local_70);
              Compiler::set_name((Compiler *)this,IVar28,(string *)local_e0);
              if ((undefined1 *)local_e0._0_8_ != local_e0 + 0x10) {
                operator_delete((void *)local_e0._0_8_);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_70._M_dataplus._M_p != &local_70.field_2) {
                operator_delete(local_70._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_50._M_dataplus._M_p != &local_50.field_2) {
                operator_delete(local_50._M_dataplus._M_p);
              }
              p_Var44 = local_b0;
              local_e0._0_4_ = local_12c.id;
              pmVar36 = ::std::__detail::
                        _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        ::operator[](local_b0,(key_type *)local_e0);
              local_124.id = (uint32_t)local_120;
              pmVar37 = ::std::__detail::
                        _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        ::operator[](p_Var44,&local_124);
              Meta::operator=(pmVar37,pmVar36);
              p_Var46 = local_108;
            }
          }
          else {
            local_e0._0_8_ = local_e0 + 0x10;
            local_e0._8_8_ = 0;
            local_e0._16_8_ = local_e0._16_8_ & 0xffffffffffffff00;
            SVar1 = local_120->storage;
            uVar39 = (uint7)(uint3)(SVar1 >> 8);
            if (SVar1 == StorageClassInput) {
              if ((local_98 & 1) != 0) {
                local_98 = CONCAT71(uVar39,1);
                goto LAB_0025618d;
              }
              pcVar41 = "gl_in";
              ::std::__cxx11::string::_M_replace((ulong)local_e0,0,(char *)0x0,0x2e9299);
              local_12c.id = (this->stage_in_ptr_var_id).id;
              local_98 = CONCAT71((int7)((ulong)pcVar41 >> 8),1);
            }
            else if (SVar1 == StorageClassOutput) {
              if ((local_a0 & 1) != 0) {
                local_a0 = CONCAT71(uVar39,1);
                goto LAB_0025618d;
              }
              pcVar41 = "gl_out";
              ::std::__cxx11::string::_M_replace((ulong)local_e0,0,(char *)0x0,0x2e06c7);
              local_12c.id = (this->stage_out_ptr_var_id).id;
              local_a0 = CONCAT71((int7)((ulong)pcVar41 >> 8),1);
            }
            pSVar38 = Variant::get<spirv_cross::SPIRVariable>
                                ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                                 super_VectorView<spirv_cross::Variant>.ptr + local_12c.id);
            local_128.id = *(uint32_t *)&(pSVar38->super_IVariant).field_0xc;
            IVar28.id = ParsedIR::increase_bound_by(local_e8,1);
            pSVar24 = local_f0;
            TVar23.id = local_128.id;
            SmallVector<spirv_cross::SPIRFunction::Parameter,_8UL>::reserve
                      (local_f8,(local_f0->arguments).
                                super_VectorView<spirv_cross::SPIRFunction::Parameter>.buffer_size +
                                1);
            this = local_118;
            pPVar3 = (pSVar24->arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.ptr
            ;
            sVar2 = (pSVar24->arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.
                    buffer_size;
            pPVar3[sVar2].type.id = TVar23.id;
            pPVar3[sVar2].id.id = IVar28.id;
            pPVar3[sVar2].read_count = 0;
            pPVar3[sVar2].write_count = 0;
            pPVar3[sVar2].alias_global_variable = true;
            (pSVar24->arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.buffer_size
                 = sVar2 + 1;
            local_124.id = 7;
            local_10c.id = 0;
            Compiler::
            set<spirv_cross::SPIRVariable,unsigned_int&,spv::StorageClass,int,unsigned_int&>
                      ((Compiler *)local_118,IVar28.id,&local_128.id,&local_124.id,(int *)&local_10c
                       ,&local_12c.id);
            Compiler::set_name((Compiler *)this,IVar28,(string *)local_e0);
            if ((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                 *)local_e0._0_8_ !=
                (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                 *)(local_e0 + 0x10)) {
              operator_delete((void *)local_e0._0_8_);
            }
          }
LAB_0025618d:
          local_108 = (_Base_ptr)::std::_Rb_tree_increment(p_Var46);
        } while (local_108 != p_Var47);
      }
    }
  }
  else {
    p_Var30 = &::std::__detail::
               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&this->function_global_vars,&local_fc)->_M_t;
    ::std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::operator=(&added_arg_ids->_M_t,p_Var30);
  }
  return;
}

Assistant:

void CompilerMSL::extract_global_variables_from_function(uint32_t func_id, std::set<uint32_t> &added_arg_ids,
                                                         unordered_set<uint32_t> &global_var_ids,
                                                         unordered_set<uint32_t> &processed_func_ids)
{
	// Avoid processing a function more than once
	if (processed_func_ids.find(func_id) != processed_func_ids.end())
	{
		// Return function global variables
		added_arg_ids = function_global_vars[func_id];
		return;
	}

	processed_func_ids.insert(func_id);

	auto &func = get<SPIRFunction>(func_id);

	// Recursively establish global args added to functions on which we depend.
	for (auto block : func.blocks)
	{
		auto &b = get<SPIRBlock>(block);
		for (auto &i : b.ops)
		{
			auto ops = stream(i);
			auto op = static_cast<Op>(i.op);

			switch (op)
			{
			case OpLoad:
			case OpInBoundsAccessChain:
			case OpAccessChain:
			case OpPtrAccessChain:
			case OpArrayLength:
			{
				uint32_t base_id = ops[2];
				if (global_var_ids.find(base_id) != global_var_ids.end())
					added_arg_ids.insert(base_id);

				// Use Metal's native frame-buffer fetch API for subpass inputs.
				auto &type = get<SPIRType>(ops[0]);
				if (type.basetype == SPIRType::Image && type.image.dim == DimSubpassData &&
				    (!msl_options.is_ios() || !msl_options.ios_use_framebuffer_fetch_subpasses))
				{
					// Implicitly reads gl_FragCoord.
					assert(builtin_frag_coord_id != 0);
					added_arg_ids.insert(builtin_frag_coord_id);
					if (msl_options.multiview)
					{
						// Implicitly reads gl_ViewIndex.
						assert(builtin_view_idx_id != 0);
						added_arg_ids.insert(builtin_view_idx_id);
					}
					else if (msl_options.arrayed_subpass_input)
					{
						// Implicitly reads gl_Layer.
						assert(builtin_layer_id != 0);
						added_arg_ids.insert(builtin_layer_id);
					}
				}

				break;
			}

			case OpFunctionCall:
			{
				// First see if any of the function call args are globals
				for (uint32_t arg_idx = 3; arg_idx < i.length; arg_idx++)
				{
					uint32_t arg_id = ops[arg_idx];
					if (global_var_ids.find(arg_id) != global_var_ids.end())
						added_arg_ids.insert(arg_id);
				}

				// Then recurse into the function itself to extract globals used internally in the function
				uint32_t inner_func_id = ops[2];
				std::set<uint32_t> inner_func_args;
				extract_global_variables_from_function(inner_func_id, inner_func_args, global_var_ids,
				                                       processed_func_ids);
				added_arg_ids.insert(inner_func_args.begin(), inner_func_args.end());
				break;
			}

			case OpStore:
			{
				uint32_t base_id = ops[0];
				if (global_var_ids.find(base_id) != global_var_ids.end())
					added_arg_ids.insert(base_id);

				uint32_t rvalue_id = ops[1];
				if (global_var_ids.find(rvalue_id) != global_var_ids.end())
					added_arg_ids.insert(rvalue_id);

				break;
			}

			case OpSelect:
			{
				uint32_t base_id = ops[3];
				if (global_var_ids.find(base_id) != global_var_ids.end())
					added_arg_ids.insert(base_id);
				base_id = ops[4];
				if (global_var_ids.find(base_id) != global_var_ids.end())
					added_arg_ids.insert(base_id);
				break;
			}

			// Emulate texture2D atomic operations
			case OpImageTexelPointer:
			{
				// When using the pointer, we need to know which variable it is actually loaded from.
				uint32_t base_id = ops[2];
				auto *var = maybe_get_backing_variable(base_id);
				if (var && atomic_image_vars.count(var->self))
				{
					if (global_var_ids.find(base_id) != global_var_ids.end())
						added_arg_ids.insert(base_id);
				}
				break;
			}

			default:
				break;
			}

			// TODO: Add all other operations which can affect memory.
			// We should consider a more unified system here to reduce boiler-plate.
			// This kind of analysis is done in several places ...
		}
	}

	function_global_vars[func_id] = added_arg_ids;

	// Add the global variables as arguments to the function
	if (func_id != ir.default_entry_point)
	{
		bool added_in = false;
		bool added_out = false;
		for (uint32_t arg_id : added_arg_ids)
		{
			auto &var = get<SPIRVariable>(arg_id);
			uint32_t type_id = var.basetype;
			auto *p_type = &get<SPIRType>(type_id);
			BuiltIn bi_type = BuiltIn(get_decoration(arg_id, DecorationBuiltIn));

			if (((is_tessellation_shader() && var.storage == StorageClassInput) ||
			     (get_execution_model() == ExecutionModelTessellationControl && var.storage == StorageClassOutput)) &&
			    !(has_decoration(arg_id, DecorationPatch) || is_patch_block(*p_type)) &&
			    (!is_builtin_variable(var) || bi_type == BuiltInPosition || bi_type == BuiltInPointSize ||
			     bi_type == BuiltInClipDistance || bi_type == BuiltInCullDistance ||
			     p_type->basetype == SPIRType::Struct))
			{
				// Tessellation control shaders see inputs and per-vertex outputs as arrays.
				// Similarly, tessellation evaluation shaders see per-vertex inputs as arrays.
				// We collected them into a structure; we must pass the array of this
				// structure to the function.
				std::string name;
				if (var.storage == StorageClassInput)
				{
					if (added_in)
						continue;
					name = "gl_in";
					arg_id = stage_in_ptr_var_id;
					added_in = true;
				}
				else if (var.storage == StorageClassOutput)
				{
					if (added_out)
						continue;
					name = "gl_out";
					arg_id = stage_out_ptr_var_id;
					added_out = true;
				}
				type_id = get<SPIRVariable>(arg_id).basetype;
				uint32_t next_id = ir.increase_bound_by(1);
				func.add_parameter(type_id, next_id, true);
				set<SPIRVariable>(next_id, type_id, StorageClassFunction, 0, arg_id);

				set_name(next_id, name);
			}
			else if (is_builtin_variable(var) && p_type->basetype == SPIRType::Struct)
			{
				// Get the pointee type
				type_id = get_pointee_type_id(type_id);
				p_type = &get<SPIRType>(type_id);

				uint32_t mbr_idx = 0;
				for (auto &mbr_type_id : p_type->member_types)
				{
					BuiltIn builtin = BuiltInMax;
					bool is_builtin = is_member_builtin(*p_type, mbr_idx, &builtin);
					if (is_builtin && has_active_builtin(builtin, var.storage))
					{
						// Add a arg variable with the same type and decorations as the member
						uint32_t next_ids = ir.increase_bound_by(2);
						uint32_t ptr_type_id = next_ids + 0;
						uint32_t var_id = next_ids + 1;

						// Make sure we have an actual pointer type,
						// so that we will get the appropriate address space when declaring these builtins.
						auto &ptr = set<SPIRType>(ptr_type_id, get<SPIRType>(mbr_type_id));
						ptr.self = mbr_type_id;
						ptr.storage = var.storage;
						ptr.pointer = true;
						ptr.parent_type = mbr_type_id;

						func.add_parameter(mbr_type_id, var_id, true);
						set<SPIRVariable>(var_id, ptr_type_id, StorageClassFunction);
						ir.meta[var_id].decoration = ir.meta[type_id].members[mbr_idx];
					}
					mbr_idx++;
				}
			}
			else
			{
				uint32_t next_id = ir.increase_bound_by(1);
				func.add_parameter(type_id, next_id, true);
				set<SPIRVariable>(next_id, type_id, StorageClassFunction, 0, arg_id);

				// Ensure the existing variable has a valid name and the new variable has all the same meta info
				set_name(arg_id, ensure_valid_name(to_name(arg_id), "v"));
				ir.meta[next_id] = ir.meta[arg_id];
			}
		}
	}
}